

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Token * __thiscall wabt::WastParser::GetToken(Token *__return_storage_ptr__,WastParser *this)

{
  Token local_78;
  
  if ((this->tokens_).size_ == 0) {
    WastLexer::GetToken(&local_78,this->lexer_,this);
    CircularArray<wabt::Token,_2UL>::push_back(&this->tokens_,&local_78);
    Token::~Token(&local_78);
    if ((this->tokens_).size_ == 0) {
      __assert_fail("index < size_",
                    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/circular-array.h"
                    ,0x34,
                    "reference wabt::CircularArray<wabt::Token, 2>::at(size_type) [T = wabt::Token, kCapacity = 2]"
                   );
    }
  }
  Token::Token(__return_storage_ptr__,
               (Token *)((long)&(this->tokens_).contents_._M_elems[0].loc.filename.data_ +
                        (ulong)(((uint)(this->tokens_).front_ & 1) * 0x50)));
  return __return_storage_ptr__;
}

Assistant:

Token WastParser::GetToken() {
  if (tokens_.empty()) {
    tokens_.push_back(lexer_->GetToken(this));
  }
  return tokens_.front();
}